

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall wasm::PrintSExpression::printMemoryHeader(PrintSExpression *this,Memory *curr)

{
  ostream *poVar1;
  string_view str;
  string_view str_00;
  
  std::operator<<(this->o,'(');
  str._M_str = "memory";
  str._M_len = 6;
  poVar1 = printMedium(this->o,str);
  std::operator<<(poVar1,' ');
  poVar1 = Name::print((Name *)curr,this->o);
  std::operator<<(poVar1,' ');
  if ((curr->addressType).id == 3) {
    std::operator<<(this->o,"i64 ");
  }
  std::ostream::_M_insert<unsigned_long>((ulong)this->o);
  if ((curr->max).addr != 0xffffffffffffffff) {
    poVar1 = std::operator<<(this->o,' ');
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  if (curr->shared == true) {
    str_00._M_str = " shared";
    str_00._M_len = 7;
    printMedium(this->o,str_00);
  }
  std::operator<<(this->o,")");
  return;
}

Assistant:

void PrintSExpression::printMemoryHeader(Memory* curr) {
  o << '(';
  printMedium(o, "memory") << ' ';
  curr->name.print(o) << ' ';
  if (curr->is64()) {
    o << "i64 ";
  }
  o << curr->initial;
  if (curr->hasMax()) {
    o << ' ' << curr->max;
  }
  if (curr->shared) {
    printMedium(o, " shared");
  }
  o << ")";
}